

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_tobit(jit_State *J,TRef tr)

{
  IRRef1 IVar1;
  TRef TVar2;
  TRef in_ESI;
  jit_State *in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  TraceError in_stack_ffffffffffffffbc;
  jit_State *in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffca;
  IRRef in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  TRef in_stack_ffffffffffffffe4;
  jit_State *in_stack_ffffffffffffffe8;
  
  if ((in_ESI & 0x1f000000) == 0x4000000) {
    (in_RDI->fold).ins.field_0.ot = 0x588e;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ESI;
    (in_RDI->fold).ins.field_0.op2 = 0;
    in_ESI = lj_opt_fold((jit_State *)
                         CONCAT44(in_ESI,CONCAT22(in_stack_ffffffffffffffca,
                                                  in_stack_ffffffffffffffc8)));
  }
  if ((in_ESI & 0x1f000000) == 0xe000000) {
    IVar1 = (IRRef1)in_ESI;
    TVar2 = lj_ir_knum_u64(in_RDI,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    (in_RDI->fold).ins.field_0.ot = 0x5613;
    (in_RDI->fold).ins.field_0.op1 = IVar1;
    (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar2 = lj_opt_fold((jit_State *)CONCAT44(in_ESI,CONCAT22(IVar1,in_stack_ffffffffffffffc8)));
  }
  else {
    if (4 < (in_ESI >> 0x18 & 0x1f) - 0xf) {
      lj_trace_err(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    TVar2 = narrow_stripov(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                           in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  return TVar2;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_tobit(jit_State *J, TRef tr)
{
  if (tref_isstr(tr))
    tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
  if (tref_isnum(tr))  /* Conversion may be narrowed, too. See above. */
    return emitir(IRTI(IR_TOBIT), tr, lj_ir_knum_tobit(J));
  if (!tref_isinteger(tr))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  /*
  ** Wrapped overflow semantics allow stripping of ADDOV and SUBOV.
  ** MULOV cannot be stripped due to precision widening.
  */
  return narrow_stripov(J, tr, IR_SUBOV, (IRT_INT<<5)|IRT_INT|IRCONV_TOBIT);
}